

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geoplg.cpp
# Opt level: O2

Stream * rw::writeMesh(Stream *stream,int32 param_2,void *object,int32 param_4,int32 param_5)

{
  uint32 *puVar1;
  int32 j;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  long *plVar6;
  ulong uVar7;
  MeshStream ms;
  MeshHeaderStream mhs;
  int32 indbuf [256];
  
  puVar1 = *(uint32 **)((long)object + 0x90);
  mhs.flags = *puVar1;
  mhs.numMeshes = (uint32)(ushort)puVar1[1];
  mhs.totalIndices = puVar1[2];
  Stream::write32(stream,&mhs,0xc);
  lVar2 = *(long *)((long)object + 0x90);
  plVar6 = (long *)(lVar2 + 0x10);
  for (uVar4 = 0; uVar4 < *(ushort *)(lVar2 + 4); uVar4 = uVar4 + 1) {
    ms.numIndices = *(uint32 *)(plVar6 + 1);
    ms.matIndex = MaterialList::findIndex
                            ((MaterialList *)((long)object + 0x80),(Material *)plVar6[2]);
    Stream::write32(stream,&ms,8);
    if ((*(byte *)((long)object + 0x13) & 1) == 0) {
      lVar2 = *plVar6;
      for (uVar5 = *(uint *)(plVar6 + 1); 0 < (int)uVar5; uVar5 = uVar5 - 0x100) {
        uVar7 = 0x100;
        if (uVar5 < 0x100) {
          uVar7 = (ulong)uVar5;
        }
        for (uVar3 = 0; uVar3 < uVar7; uVar3 = uVar3 + 1) {
          indbuf[uVar3] = (uint)*(ushort *)(lVar2 + uVar3 * 2);
        }
        Stream::write32(stream,indbuf,(int)uVar7 * 4);
        lVar2 = lVar2 + uVar7 * 2;
      }
    }
    else if (**(int **)((long)object + 0x98) == 0xb) {
      Stream::write16(stream,(void *)*plVar6,(int)plVar6[1] * 2);
    }
    plVar6 = plVar6 + 3;
    lVar2 = *(long *)((long)object + 0x90);
  }
  return stream;
}

Assistant:

static Stream*
writeMesh(Stream *stream, int32, void *object, int32, int32)
{
	MeshHeaderStream mhs;
	MeshStream ms;
	int32 indbuf[256];
	Geometry *geo = (Geometry*)object;
	mhs.flags = geo->meshHeader->flags;
	mhs.numMeshes = geo->meshHeader->numMeshes;
	mhs.totalIndices = geo->meshHeader->totalIndices;
	stream->write32(&mhs, sizeof(MeshHeaderStream));
	Mesh *mesh = geo->meshHeader->getMeshes();
	for(uint32 i = 0; i < geo->meshHeader->numMeshes; i++){
		ms.numIndices = mesh->numIndices;
		ms.matIndex = geo->matList.findIndex(mesh->material);
		stream->write32(&ms, sizeof(MeshStream));
		if(geo->flags & Geometry::NATIVE){
			assert(geo->instData != nil);
			if(geo->instData->platform == PLATFORM_WDGL)
				stream->write16(mesh->indices,
				            mesh->numIndices*2);
		}else{
			uint16 *ind = mesh->indices;
			int32 numIndices = mesh->numIndices;
			for(; numIndices > 0; numIndices -= 256){
				int32 n = numIndices < 256 ? numIndices : 256;
				for(int32 j = 0; j < n; j++)
					indbuf[j] = ind[j];
				stream->write32(indbuf, n*4);
				ind += n;
			}
		}
		mesh++;
	}
	return stream;
}